

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  char *ptr;
  uint uVar1;
  uint uVar2;
  char *tempwrite;
  int newstate;
  CURLcode result;
  SingleRequest *k;
  int action_local;
  Curl_easy *data_local;
  
  tempwrite._4_4_ = CURLE_OK;
  uVar1 = 0;
  if ((action & 1U) != 0) {
    uVar1 = 0x10;
  }
  uVar2 = 0;
  if ((action & 4U) != 0) {
    uVar2 = 0x20;
  }
  (data->req).keepon = uVar1 | uVar2 | (data->req).keepon & 0xffffffcfU;
  if ((uVar1 == 0) && ((data->state).tempwrite != (char *)0x0)) {
    ptr = (data->state).tempwrite;
    (data->state).tempwrite = (char *)0x0;
    tempwrite._4_4_ =
         Curl_client_chop_write
                   (data->easy_conn,(data->state).tempwritetype,ptr,(data->state).tempwritesize);
    (*Curl_cfree)(ptr);
  }
  if ((tempwrite._4_4_ == CURLE_OK) && ((uVar1 | uVar2) != 0x30)) {
    Curl_expire(data,0);
  }
  return tempwrite._4_4_;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;

  /* first switch off both pause bits */
  int newstate = k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* set the new desired pause bits */
  newstate |= ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE) && data->state.tempwrite) {
    /* we have a buffer for sending that we now seem to be able to deliver
       since the receive pausing is lifted! */

    /* get the pointer in local copy since the function may return PAUSE
       again and then we'll get a new copy allocted and stored in
       the tempwrite variables */
    char *tempwrite = data->state.tempwrite;

    data->state.tempwrite = NULL;
    result = Curl_client_chop_write(data->easy_conn, data->state.tempwritetype,
                                    tempwrite, data->state.tempwritesize);
    free(tempwrite);
  }

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if(!result &&
     ((newstate&(KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
      (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) )
    Curl_expire(data, 0); /* get this handle going again */

  return result;
}